

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-file.cc
# Opt level: O0

void __thiscall PcapFile::HandleFragment(PcapFile *this,shared_ptr<Ipv4Packet> *ipv4p,istream *is)

{
  bool bVar1;
  uint8_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  long in_RDI;
  shared_ptr<EigrpPacket> eigrpp;
  stringstream ss;
  shared_ptr<Ipv4Fragment> frag;
  iterator iter;
  iterator temp_iter;
  stringstream *in_stack_fffffffffffffd08;
  Ipv4Fragment *in_stack_fffffffffffffd10;
  __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
  *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  uint8_t in_stack_fffffffffffffd27;
  const_iterator in_stack_fffffffffffffd28;
  unsigned_short *in_stack_fffffffffffffd30;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38
  ;
  undefined4 in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd44;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  shared_ptr<Ipv4Packet> *p;
  shared_ptr<Packet> *l4p;
  PcapFile *in_stack_fffffffffffffd60;
  stringstream local_220 [392];
  shared_ptr<Packet> local_98;
  shared_ptr<Ipv4Packet> local_88;
  shared_ptr<Ipv4Fragment> *local_78;
  shared_ptr<Ipv4Fragment> *local_70;
  shared_ptr<Ipv4Fragment> *local_58;
  shared_ptr<Ipv4Fragment> *local_30;
  __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (shared_ptr<Ipv4Fragment> *)
       std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>::
       end((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_> *
           )in_stack_fffffffffffffd08);
  local_28._M_current =
       (shared_ptr<Ipv4Fragment> *)
       std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>::
       begin((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
              *)in_stack_fffffffffffffd08);
  do {
    local_30 = (shared_ptr<Ipv4Fragment> *)
               std::
               vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
               ::end((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                      *)in_stack_fffffffffffffd08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                        *)in_stack_fffffffffffffd08);
    if (!bVar1) {
LAB_0015df24:
      local_58 = (shared_ptr<Ipv4Fragment> *)
                 std::
                 vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                 ::end((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                        *)in_stack_fffffffffffffd08);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                          *)in_stack_fffffffffffffd10,
                         (__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                          *)in_stack_fffffffffffffd08);
      if (bVar1) {
        in_stack_fffffffffffffd60 = (PcapFile *)(in_RDI + 0x60);
        std::make_shared<Ipv4Fragment,std::shared_ptr<Ipv4Packet>&>
                  ((shared_ptr<Ipv4Packet> *)in_stack_fffffffffffffd38);
        std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
        ::push_back((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                     *)in_stack_fffffffffffffd10,(value_type *)in_stack_fffffffffffffd08);
        std::shared_ptr<Ipv4Fragment>::~shared_ptr((shared_ptr<Ipv4Fragment> *)0x15dfa4);
        local_78 = (shared_ptr<Ipv4Fragment> *)
                   std::
                   vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                   ::end((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                          *)in_stack_fffffffffffffd08);
        local_70 = (shared_ptr<Ipv4Fragment> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                   ::operator-(in_stack_fffffffffffffd18,(difference_type)in_stack_fffffffffffffd10)
        ;
        local_20[0] = (__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                       )local_70;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
      ::operator*(local_20);
      p = &local_88;
      std::shared_ptr<Ipv4Fragment>::shared_ptr
                ((shared_ptr<Ipv4Fragment> *)in_stack_fffffffffffffd10,
                 (shared_ptr<Ipv4Fragment> *)in_stack_fffffffffffffd08);
      peVar3 = std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15e03b);
      l4p = &local_98;
      std::shared_ptr<Ipv4Packet>::shared_ptr
                ((shared_ptr<Ipv4Packet> *)in_stack_fffffffffffffd10,
                 (shared_ptr<Ipv4Packet> *)in_stack_fffffffffffffd08);
      Ipv4Fragment::Add(peVar3,p,(istream *)
                                 CONCAT17(in_stack_fffffffffffffd47,
                                          CONCAT16(in_stack_fffffffffffffd46,
                                                   CONCAT24(in_stack_fffffffffffffd44,
                                                            in_stack_fffffffffffffd40))));
      std::shared_ptr<Ipv4Packet>::~shared_ptr((shared_ptr<Ipv4Packet> *)0x15e080);
      peVar4 = std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15e08d);
      bVar1 = Ipv4Fragment::IsComplete(peVar4);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_220);
        std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x15e0c4);
        Ipv4Fragment::get_data(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        peVar4 = std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15e0e3);
        uVar2 = Ipv4Fragment::get_protocol(peVar4);
        if (uVar2 == 'X') {
          peVar4 = std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x15e10e);
          Ipv4Fragment::get_tlen(peVar4);
          std::make_shared<EigrpPacket,std::__cxx11::stringstream&,unsigned_short>
                    (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          std::shared_ptr<Packet>::shared_ptr<EigrpPacket,void>
                    ((shared_ptr<Packet> *)in_stack_fffffffffffffd10,
                     (shared_ptr<EigrpPacket> *)in_stack_fffffffffffffd08);
          std::shared_ptr<Ipv4Fragment>::shared_ptr
                    ((shared_ptr<Ipv4Fragment> *)in_stack_fffffffffffffd10,
                     (shared_ptr<Ipv4Fragment> *)in_stack_fffffffffffffd08);
          InsertL4Packet(in_stack_fffffffffffffd60,l4p,(shared_ptr<Ipv4Fragment> *)peVar3);
          std::shared_ptr<Ipv4Fragment>::~shared_ptr((shared_ptr<Ipv4Fragment> *)0x15e1a3);
          std::shared_ptr<Packet>::~shared_ptr((shared_ptr<Packet> *)0x15e1b0);
          std::shared_ptr<EigrpPacket>::~shared_ptr((shared_ptr<EigrpPacket> *)0x15e1bd);
        }
        else {
          in_stack_fffffffffffffd28._M_current =
               (shared_ptr<Ipv4Fragment> *)
               std::operator<<((ostream *)&std::cout,"unknow protocol: ");
          peVar3 = std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x15e281);
          in_stack_fffffffffffffd27 = Ipv4Fragment::get_protocol(peVar3);
          poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffd28._M_current,
                                   in_stack_fffffffffffffd27);
          std::operator<<(poVar5,'\n');
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Ipv4Fragment>const*,std::vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>>
        ::__normal_iterator<std::shared_ptr<Ipv4Fragment>*>
                  ((__normal_iterator<const_std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                    *)in_stack_fffffffffffffd10,
                   (__normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
                    *)(in_RDI + 0x60));
        std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
        ::erase((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
                 *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                in_stack_fffffffffffffd28);
        std::__cxx11::stringstream::~stringstream(local_220);
      }
      std::shared_ptr<Ipv4Fragment>::~shared_ptr((shared_ptr<Ipv4Fragment> *)0x15e32f);
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
    ::operator*(&local_28);
    std::__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x15de8d);
    std::shared_ptr<Ipv4Packet>::shared_ptr
              ((shared_ptr<Ipv4Packet> *)in_stack_fffffffffffffd10,
               (shared_ptr<Ipv4Packet> *)in_stack_fffffffffffffd08);
    bVar1 = Ipv4Fragment::IsSameIpPacket
                      ((Ipv4Fragment *)in_stack_fffffffffffffd28._M_current,
                       (shared_ptr<Ipv4Packet> *)
                       CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::shared_ptr<Ipv4Packet>::~shared_ptr((shared_ptr<Ipv4Packet> *)0x15dece);
    if (bVar1) {
      local_20[0]._M_current = local_28._M_current;
      goto LAB_0015df24;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Ipv4Fragment>_*,_std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void PcapFile::HandleFragment(std::shared_ptr<Ipv4Packet> ipv4p, std::istream& is)
{
    auto temp_iter = fragments.end();
    for (auto iter = fragments.begin(); iter != fragments.end(); ++iter)
    {
        if ((*iter)->IsSameIpPacket(ipv4p))
        {
            temp_iter = iter;
            break;
        }
    }

    if (temp_iter == fragments.end())
    {
        fragments.push_back(std::make_shared<Ipv4Fragment>(ipv4p));
        temp_iter = fragments.end() - 1;
    }

    auto frag = *temp_iter;
    frag->Add(ipv4p, is);

    if (frag->IsComplete())
    {
        //将完整的ip包数据提取出来
        std::stringstream ss;
        frag->get_data(ss);
        if (frag->get_protocol() == 88)  // eigrp
        {
            auto eigrpp = std::make_shared<EigrpPacket>(ss, frag->get_tlen());
            InsertL4Packet(eigrpp, frag);
        }
        else
        {
            std::cout << "unknow protocol: " << frag->get_protocol() << '\n';
        }
        //将用完的fragment删掉，节省空间和时间
        fragments.erase(temp_iter);
    }
}